

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O3

void __thiscall ghc::filesystem::path::iterator::updateCurrent(iterator *this)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var4;
  char *pcVar5;
  char *pcVar6;
  bool bVar7;
  
  pcVar1 = (this->_last)._M_current;
  pcVar2 = (this->_iter)._M_current;
  if (pcVar2 != pcVar1) {
    if (pcVar2 == (this->_first)._M_current) {
      if ((this->_prefix)._M_current <= pcVar2) {
        bVar7 = true;
        if (*pcVar2 == '/') goto LAB_0011f6ab;
LAB_0011f6f1:
        if ((pcVar2 + 1 == pcVar1) || (pcVar2[1] != ':')) goto LAB_0011f702;
      }
      goto LAB_0011f719;
    }
    if ((pcVar2 + 1 != pcVar1 || pcVar2 == (this->_root)._M_current) || *pcVar2 != '/') {
      pcVar5 = (this->_prefix)._M_current;
      bVar7 = pcVar5 == pcVar2;
      if (*pcVar2 == '/') {
LAB_0011f6ab:
        pcVar6 = pcVar2 + 1;
        if ((pcVar6 != pcVar1) && (*pcVar6 == '/')) {
          if ((bVar7) && ((pcVar5 = pcVar2 + 2, pcVar5 == pcVar1 || (*pcVar5 != '/'))))
          goto LAB_0011f70c;
          do {
            if (*pcVar6 != '/') break;
            pcVar6 = pcVar6 + 1;
          } while (pcVar6 != pcVar1);
        }
      }
      else {
        if (pcVar5 == pcVar2) goto LAB_0011f6f1;
LAB_0011f702:
        pcVar5 = pcVar2 + 1;
LAB_0011f70c:
        std::
        __find_if<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                  (pcVar5,pcVar1,&path_helper_base<char>::preferred_separator);
      }
LAB_0011f719:
      std::__cxx11::string::replace
                ((ulong)&this->_current,0,(char *)(this->_current)._path._M_string_length,
                 (ulong)pcVar2);
      pcVar1 = (this->_current)._path._M_dataplus._M_p;
      uVar3 = (this->_current)._path._M_string_length;
      if ((((uVar3 < 3) || (*pcVar1 != '/')) || (pcVar1[1] != '/')) || (pcVar1[2] == '/')) {
        _Var4 = std::
                __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_2_>>
                          (pcVar1,pcVar1 + uVar3);
      }
      else {
        _Var4 = std::
                __unique<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_comp_iter<ghc::filesystem::path::postprocess_path_with_format(ghc::filesystem::path::format)::_lambda(char,char)_1_>>
                          (pcVar1 + 2,pcVar1 + uVar3);
      }
      (this->_current)._path._M_string_length =
           (long)_Var4._M_current - (long)(this->_current)._path._M_dataplus._M_p;
      goto LAB_0011f75f;
    }
  }
  (this->_current)._path._M_string_length = 0;
  _Var4._M_current = (this->_current)._path._M_dataplus._M_p;
LAB_0011f75f:
  *_Var4._M_current = '\0';
  return;
}

Assistant:

GHC_INLINE void path::iterator::updateCurrent()
{
    if ((_iter == _last) || (_iter != _first && _iter != _last && (*_iter == preferred_separator && _iter != _root) && (_iter + 1 == _last))) {
        _current.clear();
    }
    else {
        _current.assign(_iter, increment(_iter));
    }
}